

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O3

int Gia_ManFindFirstCommonLit(Vec_Int_t *vArr1,Vec_Int_t *vArr2,int fVerbose)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint *puVar4;
  uint *puVar5;
  int iVar6;
  uint *puVar7;
  uint *puVar8;
  uint *puVar9;
  uint *puVar10;
  
  puVar4 = (uint *)vArr1->pArray;
  puVar5 = (uint *)vArr2->pArray;
  iVar6 = vArr1->nSize;
  iVar1 = vArr2->nSize;
  puVar7 = puVar5;
  puVar8 = puVar4;
  puVar9 = puVar5;
  puVar10 = puVar4;
  if (0 < iVar1 && 0 < (long)iVar6) {
    do {
      uVar2 = *puVar10;
      if (((int)uVar2 < 0) || (uVar3 = *puVar9, (int)uVar3 < 0)) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x12f,"int Abc_Lit2Var(int)");
      }
      if ((uVar3 ^ uVar2) < 2) {
        if (uVar2 != uVar3) {
          return uVar2;
        }
        puVar10 = puVar10 + 1;
        puVar9 = puVar9 + 1;
      }
      else if (uVar2 < uVar3) {
        puVar10 = puVar10 + 1;
        *puVar8 = uVar2;
        puVar8 = puVar8 + 1;
      }
      else {
        puVar9 = puVar9 + 1;
        *puVar7 = uVar3;
        puVar7 = puVar7 + 1;
      }
    } while ((puVar10 < puVar4 + iVar6) && (puVar9 < puVar5 + iVar1));
  }
  for (; puVar10 < puVar4 + iVar6; puVar10 = puVar10 + 1) {
    *puVar8 = *puVar10;
    puVar8 = puVar8 + 1;
  }
  for (; puVar9 < puVar5 + iVar1; puVar9 = puVar9 + 1) {
    *puVar7 = *puVar9;
    puVar7 = puVar7 + 1;
  }
  iVar6 = (int)((ulong)((long)puVar8 - (long)puVar4) >> 2);
  if (iVar6 <= vArr1->nSize) {
    vArr1->nSize = iVar6;
    iVar6 = (int)((ulong)((long)puVar7 - (long)puVar5) >> 2);
    if (iVar6 <= vArr2->nSize) {
      vArr2->nSize = iVar6;
      return -1;
    }
  }
  __assert_fail("p->nSize >= nSizeNew",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
}

Assistant:

static inline int Gia_ManFindFirstCommonLit( Vec_Int_t * vArr1, Vec_Int_t * vArr2, int fVerbose )
{
    int * pBeg1 = vArr1->pArray;
    int * pBeg2 = vArr2->pArray;
    int * pEnd1 = vArr1->pArray + vArr1->nSize;
    int * pEnd2 = vArr2->pArray + vArr2->nSize;
    int * pStart1 = vArr1->pArray;
    int * pStart2 = vArr2->pArray;
    int nRemoved = 0;
    while ( pBeg1 < pEnd1 && pBeg2 < pEnd2 )
    {
        if ( Abc_Lit2Var(*pBeg1) == Abc_Lit2Var(*pBeg2) )
        { 
            if ( *pBeg1 != *pBeg2 ) 
                return *pBeg1; 
            else
                pBeg1++, pBeg2++;
            nRemoved++;
        }
        else if ( *pBeg1 < *pBeg2 )
            *pStart1++ = *pBeg1++;
        else 
            *pStart2++ = *pBeg2++;
    }
    while ( pBeg1 < pEnd1 )
        *pStart1++ = *pBeg1++;
    while ( pBeg2 < pEnd2 )
        *pStart2++ = *pBeg2++;
    Vec_IntShrink( vArr1, pStart1 - vArr1->pArray );
    Vec_IntShrink( vArr2, pStart2 - vArr2->pArray );
    //if ( fVerbose ) printf( "Removed %d duplicated entries.  Array1 = %d.  Array2 = %d.\n", nRemoved, Vec_IntSize(vArr1), Vec_IntSize(vArr2) );
    return -1;
}